

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.h
# Opt level: O2

void __thiscall booster::aio::const_buffer::const_buffer(const_buffer *this,mutable_buffer *other)

{
  uint uVar1;
  ulong uVar2;
  pair<const_booster::aio::buffer_impl<char_*>::entry_*,_unsigned_long> pVar3;
  
  (this->super_buffer_impl<const_char_*>).size_ = 0;
  (this->super_buffer_impl<const_char_*>).vec_.
  super__Vector_base<booster::aio::buffer_impl<const_char_*>::entry,_std::allocator<booster::aio::buffer_impl<const_char_*>::entry>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_buffer_impl<const_char_*>).vec_.
  super__Vector_base<booster::aio::buffer_impl<const_char_*>::entry,_std::allocator<booster::aio::buffer_impl<const_char_*>::entry>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_buffer_impl<const_char_*>).vec_.
  super__Vector_base<booster::aio::buffer_impl<const_char_*>::entry,_std::allocator<booster::aio::buffer_impl<const_char_*>::entry>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pVar3 = buffer_impl<char_*>::get(&other->super_buffer_impl<char_*>);
  for (uVar1 = 0; uVar2 = (ulong)uVar1, uVar2 < pVar3.second; uVar1 = uVar1 + 1) {
    buffer_impl<const_char_*>::add
              (&this->super_buffer_impl<const_char_*>,pVar3.first[uVar2].ptr,pVar3.first[uVar2].size
              );
  }
  return;
}

Assistant:

const_buffer(mutable_buffer const &other) 
			{
				mutable_buffer::buffer_data_type data = other.get();
				for(unsigned i=0;i<data.second;i++)
					add(data.first[i].ptr,data.first[i].size);
			}